

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

callbacks __thiscall
pstore::exchange::import_ns::callbacks::make<pstore::exchange::import_ns::root>
          (callbacks *this,not_null<pstore::database_*> db)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  callbacks cVar1;
  unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
  local_38;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_30;
  undefined1 local_28 [8];
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  not_null<pstore::database_*> db_local;
  
  ctxt.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)db.ptr_;
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)local_28);
  std::__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2> *)
             local_28);
  std::make_unique<pstore::exchange::import_ns::root,pstore::exchange::import_ns::context*>
            ((context **)&local_38);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::root,std::default_delete<pstore::exchange::import_ns::root>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_30,&local_38);
  callbacks(this,(shared_ptr<pstore::exchange::import_ns::context> *)local_28,&local_30);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_30);
  std::
  unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
  ::~unique_ptr(&local_38);
  std::shared_ptr<pstore::exchange::import_ns::context>::~shared_ptr
            ((shared_ptr<pstore::exchange::import_ns::context> *)local_28);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }